

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

int xmlExpandCatalog(xmlCatalogPtr catal,char *filename)

{
  _xmlCatalogEntry *p_Var1;
  int iVar2;
  xmlChar *value;
  xmlCatalogEntryPtr pxVar3;
  xmlCatalogEntryPtr pxVar4;
  
  iVar2 = -1;
  if (filename != (char *)0x0) {
    if (catal->type == XML_SGML_CATALOG_TYPE) {
      value = xmlLoadFileContent(filename);
      if (value != (xmlChar *)0x0) {
        iVar2 = xmlParseSGMLCatalog(catal,value,filename,0);
        (*xmlFree)(value);
        iVar2 = iVar2 >> 0x1f;
      }
    }
    else {
      iVar2 = 0;
      pxVar3 = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)filename
                                  ,xmlCatalogDefaultPrefer,(xmlCatalogEntryPtr)0x0);
      p_Var1 = catal->xml;
      if (catal->xml == (xmlCatalogEntryPtr)0x0) {
        catal->xml = pxVar3;
      }
      else {
        do {
          pxVar4 = p_Var1;
          p_Var1 = pxVar4->next;
        } while (p_Var1 != (_xmlCatalogEntry *)0x0);
        pxVar4->next = pxVar3;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
xmlExpandCatalog(xmlCatalogPtr catal, const char *filename)
{
    int ret;

    if ((catal == NULL) || (filename == NULL))
	return(-1);


    if (catal->type == XML_SGML_CATALOG_TYPE) {
	xmlChar *content;

	content = xmlLoadFileContent(filename);
	if (content == NULL)
	    return(-1);

        ret = xmlParseSGMLCatalog(catal, content, filename, 0);
	if (ret < 0) {
	    xmlFree(content);
	    return(-1);
	}
	xmlFree(content);
    } else {
	xmlCatalogEntryPtr tmp, cur;
	tmp = xmlNewCatalogEntry(XML_CATA_CATALOG, NULL,
		       NULL, BAD_CAST filename, xmlCatalogDefaultPrefer, NULL);

	cur = catal->xml;
	if (cur == NULL) {
	    catal->xml = tmp;
	} else {
	    while (cur->next != NULL) cur = cur->next;
	    cur->next = tmp;
	}
    }
    return (0);
}